

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

void fmt::v6::print<char[19],int&,char_const*&,char>
               (char (*format_str) [19],int *args,char **args_1)

{
  remove_reference_t<const_char_*&> *in_R8;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  local_98;
  string_view local_88;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>,_int,_const_char_*>
  local_78;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>,_int,_const_char_*>
  *local_50;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>,_int,_const_char_*>
  *vargs;
  char **args_local_1;
  int *args_local;
  char (*format_str_local) [19];
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *local_28;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>,_int,_const_char_*>
  *local_20;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  *local_18;
  format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>,_int,_const_char_*>
  *local_10;
  
  vargs = (format_arg_store<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>,_int,_const_char_*>
           *)args_1;
  args_local_1 = (char **)args;
  args_local = (int *)format_str;
  detail::make_args_checked<int&,char_const*&,char[19],char>
            (&local_78,(detail *)format_str,(char (*) [19])args,(remove_reference_t<int_&> *)args_1,
             in_R8);
  local_50 = &local_78;
  local_88 = to_string_view<char,_0>((char *)args_local);
  local_28 = &local_98;
  format_str_local = (char (*) [19])local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
  ::basic_format_args(local_28,0xc1,
                      (value<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::detail::buffer<char>_>,_char>_>
                       *)local_50);
  vprint(local_88,(format_args)local_98);
  return;
}

Assistant:

inline void print(const S& format_str, Args&&... args) {
  const auto& vargs = detail::make_args_checked<Args...>(format_str, args...);
  return detail::is_unicode<Char>()
             ? vprint(to_string_view(format_str), vargs)
             : detail::vprint_mojibake(stdout, to_string_view(format_str),
                                       vargs);
}